

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS
ref_subdiv_unmark_tet_face
          (REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell,REF_BOOL *again,REF_INT s0,
          REF_INT s1,REF_INT s2)

{
  REF_INT e0;
  REF_INT e1;
  REF_INT e1_00;
  REF_BOOL *pRVar1;
  
  e0 = ref_subdiv_c2e(ref_subdiv,ref_cell,s0,cell);
  e1 = ref_subdiv_c2e(ref_subdiv,ref_cell,s1,cell);
  e1_00 = ref_subdiv_c2e(ref_subdiv,ref_cell,s2,cell);
  pRVar1 = ref_subdiv->mark;
  if (pRVar1[e0] != 0) {
    if ((pRVar1[e1] != 0) && (pRVar1[e1_00] == 0)) {
      ref_subdiv_unmark_one_of_two(ref_subdiv,e0,e1);
      *again = 1;
      pRVar1 = ref_subdiv->mark;
      if (pRVar1[e0] == 0) goto LAB_001d5983;
    }
    if ((pRVar1[e1] != 0) || (pRVar1[e1_00] == 0)) goto LAB_001d59a9;
    ref_subdiv_unmark_one_of_two(ref_subdiv,e0,e1_00);
    *again = 1;
    pRVar1 = ref_subdiv->mark;
    if (pRVar1[e0] != 0) goto LAB_001d59a9;
  }
LAB_001d5983:
  if ((pRVar1[e1] != 0) && (pRVar1[e1_00] != 0)) {
    ref_subdiv_unmark_one_of_two(ref_subdiv,e1,e1_00);
    *again = 1;
    pRVar1 = again;
  }
LAB_001d59a9:
  return (REF_STATUS)pRVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_tet_face(
    REF_SUBDIV ref_subdiv, REF_CELL ref_cell, REF_INT cell, REF_BOOL *again,
    REF_INT s0, REF_INT s1, REF_INT s2) {
  REF_INT e0, e1, e2;
  e0 = ref_subdiv_c2e(ref_subdiv, ref_cell, s0, cell);
  e1 = ref_subdiv_c2e(ref_subdiv, ref_cell, s1, cell);
  e2 = ref_subdiv_c2e(ref_subdiv, ref_cell, s2, cell);
  if (ref_subdiv_mark(ref_subdiv, e0) && ref_subdiv_mark(ref_subdiv, e1) &&
      !ref_subdiv_mark(ref_subdiv, e2)) {
    ref_subdiv_unmark_one_of_two(ref_subdiv, e0, e1);
    *again = REF_TRUE;
  }
  if (ref_subdiv_mark(ref_subdiv, e0) && !ref_subdiv_mark(ref_subdiv, e1) &&
      ref_subdiv_mark(ref_subdiv, e2)) {
    ref_subdiv_unmark_one_of_two(ref_subdiv, e0, e2);
    *again = REF_TRUE;
  }
  if (!ref_subdiv_mark(ref_subdiv, e0) && ref_subdiv_mark(ref_subdiv, e1) &&
      ref_subdiv_mark(ref_subdiv, e2)) {
    ref_subdiv_unmark_one_of_two(ref_subdiv, e1, e2);
    *again = REF_TRUE;
  }

  return REF_SUCCESS;
}